

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::InvalidateFboUnbindReadCase::render
          (InvalidateFboUnbindReadCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  int i;
  DataType outputType;
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  TextureFormat TVar4;
  Context *pCVar5;
  TransferFormat TVar6;
  long lVar7;
  ChannelOrder CVar8;
  deUint32 depthStencilTex;
  deUint32 colorTex;
  DataTypes local_3e8;
  deUint32 local_3c8;
  deUint32 fbo;
  Vec4 local_3c0;
  ulong local_3b0;
  TextureFormat colorFmt;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  Vec4 local_378;
  TextureFormatInfo colorFmtInfo;
  Texture2DShader texShader;
  GradientShader gradShader;
  
  colorFmt = glu::mapGLInternalFormat(this->m_colorFmt);
  if (this->m_depthStencilFmt == 0) {
    TVar4.order = CHANNELORDER_LAST;
    TVar4.type = SNORM_INT8;
    local_3b0 = 0x2600000000;
  }
  else {
    TVar4 = glu::mapGLInternalFormat(this->m_depthStencilFmt);
    local_3b0 = (ulong)TVar4 & 0xffffffff00000000;
  }
  tcu::getTextureFormatInfo(&colorFmtInfo,&colorFmt);
  fbo = 0;
  colorTex = 0;
  depthStencilTex = 0;
  outputType = FboTestUtil::getFragmentOutputType(&colorFmt);
  FboTestUtil::GradientShader::GradientShader(&gradShader,outputType);
  getFBODiscardAttachments(&attachments,this->m_invalidateBuffers);
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_3c8 = (*pCVar5->_vptr_Context[0x75])(pCVar5,&gradShader);
  TVar6 = glu::getTransferFormat(colorFmt);
  sglr::ContextWrapper::glGenTextures(this_00,1,&colorTex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,colorTex);
  dVar3 = this->m_colorFmt;
  iVar1 = sglr::ContextWrapper::getWidth(this_00);
  iVar2 = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glTexImage2D
            (this_00,0xde1,0,dVar3,iVar1,iVar2,0,TVar6.format,TVar6.dataType,(void *)0x0);
  sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
  CVar8 = TVar4.order;
  if (this->m_depthStencilFmt != 0) {
    TVar6 = glu::getTransferFormat((TextureFormat)(local_3b0 | (ulong)TVar4 & 0xffffffff));
    sglr::ContextWrapper::glGenTextures(this_00,1,&depthStencilTex);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,depthStencilTex);
    dVar3 = this->m_depthStencilFmt;
    iVar1 = sglr::ContextWrapper::getWidth(this_00);
    iVar2 = sglr::ContextWrapper::getHeight(this_00);
    sglr::ContextWrapper::glTexImage2D
              (this_00,0xde1,0,dVar3,iVar1,iVar2,0,TVar6.format,TVar6.dataType,(void *)0x0);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  }
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,colorTex,0);
  if ((CVar8 == DS) || (CVar8 == D)) {
    sglr::ContextWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8d00,0xde1,depthStencilTex,0);
  }
  if (CVar8 - S < 2) {
    sglr::ContextWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8d20,0xde1,depthStencilTex,0);
  }
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  sglr::ContextWrapper::glClearColor(this_00,0.0,0.0,0.0,1.0);
  sglr::ContextWrapper::glClear(this_00,0x4500);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::GradientShader::setGradient
            (&gradShader,pCVar5,local_3c8,&colorFmtInfo.valueMin,&colorFmtInfo.valueMax);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  texShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)0xbf800000bf800000;
  texShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xbf800000;
  local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_3f8000003f800000;
  local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_3e8.vec.
                         super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                         super__Vector_impl_data._M_finish._4_4_,0x3f800000);
  sglr::drawQuad(pCVar5,local_3c8,(Vec3 *)&texShader,(Vec3 *)&local_3e8);
  sglr::ContextWrapper::glInvalidateFramebuffer
            (this_00,0x8d40,
             (int)((ulong)((long)attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)attachments.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2),
             attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,0);
  sglr::ContextWrapper::glDisable(this_00,0xb71);
  sglr::ContextWrapper::glDisable(this_00,0xb90);
  if ((this->m_invalidateBuffers & 0x100) == 0) {
    local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish = (DataType *)0x0;
    local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (DataType *)0x0;
    local_3c0.m_data[0] =
         (float)glu::getSampler2DType((TextureFormat)(local_3b0 | (ulong)TVar4 & 0xffffffff));
    if (local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::DataType,std::allocator<glu::DataType>>::
      _M_realloc_insert<glu::DataType_const&>
                ((vector<glu::DataType,std::allocator<glu::DataType>> *)&local_3e8,
                 (iterator)
                 local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(DataType *)&local_3c0);
    }
    else {
      *local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
       super__Vector_impl_data._M_finish = (DataType)local_3c0.m_data[0];
      local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    lVar7 = 0;
    do {
      local_3c0.m_data[lVar7] = 1.0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    local_378.m_data[0] = 0.0;
    local_378.m_data[1] = 0.0;
    local_378.m_data[2] = 0.0;
    local_378.m_data[3] = 0.0;
    FboTestUtil::Texture2DShader::Texture2DShader
              (&texShader,&local_3e8,TYPE_FLOAT_VEC4,&local_3c0,&local_378);
    if (local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3e8.vec.
                      super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3e8.vec.
                            super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3e8.vec.
                            super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
    dVar3 = (*pCVar5->_vptr_Context[0x75])(pCVar5,&texShader);
    pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
    FboTestUtil::Texture2DShader::setUniforms(&texShader,pCVar5,dVar3);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,depthStencilTex);
    pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
    local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)local_3e8.vec.
                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffff00000000);
    local_3c0.m_data._0_8_ = &DAT_3f8000003f800000;
    local_3c0.m_data[2] = 0.0;
    sglr::drawQuad(pCVar5,dVar3,(Vec3 *)&local_3e8,(Vec3 *)&local_3c0);
  }
  else {
    local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish = (DataType *)0x0;
    local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (DataType *)0x0;
    local_3c0.m_data[0] = (float)glu::getSampler2DType(colorFmt);
    if (local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glu::DataType,std::allocator<glu::DataType>>::
      _M_realloc_insert<glu::DataType_const&>
                ((vector<glu::DataType,std::allocator<glu::DataType>> *)&local_3e8,
                 (iterator)
                 local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(DataType *)&local_3c0);
    }
    else {
      *local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
       super__Vector_impl_data._M_finish = (DataType)local_3c0.m_data[0];
      local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    lVar7 = 0;
    do {
      local_3c0.m_data[lVar7] = 1.0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    local_378.m_data[0] = 0.0;
    local_378.m_data[1] = 0.0;
    local_378.m_data[2] = 0.0;
    local_378.m_data[3] = 0.0;
    FboTestUtil::Texture2DShader::Texture2DShader
              (&texShader,&local_3e8,TYPE_FLOAT_VEC4,&local_3c0,&local_378);
    if (local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3e8.vec.
                      super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3e8.vec.
                            super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3e8.vec.
                            super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
    dVar3 = (*pCVar5->_vptr_Context[0x75])(pCVar5);
    FboTestUtil::Texture2DShader::setTexScaleBias
              (&texShader,0,&colorFmtInfo.lookupScale,&colorFmtInfo.lookupBias);
    pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
    FboTestUtil::Texture2DShader::setUniforms(&texShader,pCVar5,dVar3);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,colorTex);
    pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xbf800000bf800000;
    local_3e8.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)local_3e8.vec.
                          super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
                          super__Vector_impl_data._M_finish & 0xffffffff00000000);
    local_3c0.m_data._0_8_ = &DAT_3f8000003f800000;
    local_3c0.m_data[2] = 0.0;
    sglr::drawQuad(pCVar5,dVar3,(Vec3 *)&local_3e8,(Vec3 *)&local_3c0);
  }
  FboTestUtil::Texture2DShader::~Texture2DShader(&texShader);
  iVar1 = sglr::ContextWrapper::getWidth(this_00);
  iVar2 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels(&this->super_FboTestCase,dst,0,0,iVar1,iVar2);
  if (attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)attachments.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)attachments.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  sglr::ShaderProgram::~ShaderProgram(&gradShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(m_colorFmt);
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFmt != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFmt) : tcu::TextureFormat();
		tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		deUint32				fbo						= 0;
		deUint32				colorTex				= 0;
		deUint32				depthStencilTex			= 0;
		GradientShader			gradShader				(getFragmentOutputType(colorFmt));
		vector<deUint32>		attachments				= getFBODiscardAttachments(m_invalidateBuffers);
		deUint32				gradShaderID			= getCurrentContext()->createProgram(&gradShader);

		// Create fbo.
		{
			glu::TransferFormat transferFmt = glu::getTransferFormat(colorFmt);

			glGenTextures	(1, &colorTex);
			glBindTexture	(GL_TEXTURE_2D, colorTex);
			glTexImage2D	(GL_TEXTURE_2D, 0, m_colorFmt, getWidth(), getHeight(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		}

		if (m_depthStencilFmt != GL_NONE)
		{
			glu::TransferFormat transferFmt = glu::getTransferFormat(depthStencilFmt);

			glGenTextures	(1, &depthStencilTex);
			glBindTexture	(GL_TEXTURE_2D, depthStencilTex);
			glTexImage2D	(GL_TEXTURE_2D, 0, m_depthStencilFmt, getWidth(), getHeight(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		}

		glGenFramebuffers		(1, &fbo);
		glBindFramebuffer		(GL_FRAMEBUFFER, fbo);
		glFramebufferTexture2D	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, colorTex, 0);

		if (depth)
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, depthStencilTex, 0);

		if (stencil)
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_TEXTURE_2D, depthStencilTex, 0);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		glClearColor	(0.0f, 0.0f, 0.0f, 1.0f);
		glClear			(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		gradShader.setGradient(*getCurrentContext(), gradShaderID, colorFmtInfo.valueMin, colorFmtInfo.valueMax);
		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), &attachments[0]);

		glBindFramebuffer	(GL_FRAMEBUFFER, 0);
		glDisable			(GL_DEPTH_TEST);
		glDisable			(GL_STENCIL_TEST);

		if ((m_invalidateBuffers & GL_DEPTH_BUFFER_BIT) != 0)
		{
			// Render color.
			Texture2DShader texShader(DataTypes() << glu::getSampler2DType(colorFmt), glu::TYPE_FLOAT_VEC4);
			deUint32		texShaderID = getCurrentContext()->createProgram(&texShader);

			texShader.setTexScaleBias(0, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
			texShader.setUniforms(*getCurrentContext(), texShaderID);

			glBindTexture(GL_TEXTURE_2D, colorTex);
			sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}
		else
		{
			// Render depth.
			Texture2DShader texShader(DataTypes() << glu::getSampler2DType(depthStencilFmt), glu::TYPE_FLOAT_VEC4);
			deUint32		texShaderID = getCurrentContext()->createProgram(&texShader);

			texShader.setUniforms(*getCurrentContext(), texShaderID);

			glBindTexture(GL_TEXTURE_2D, depthStencilTex);
			sglr::drawQuad(*getCurrentContext(), texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		}

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}